

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Vector.H
# Opt level: O0

Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *
amrex::GetVecOfPtrs<amrex::MultiFab>
          (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           *a)

{
  bool bVar1;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_RDI;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *x;
  const_iterator __end0;
  const_iterator __begin0;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  *__range2;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *r;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_*,_std::vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
  in_stack_ffffffffffffffc8;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_ffffffffffffffd0;
  
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x5a0c55);
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::size((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          *)0x5a0c5f);
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::reserve
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::begin(in_stack_ffffffffffffff98);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_*,_std::vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_*,_std::vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_*,_std::vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
    ::operator*((__normal_iterator<const_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_*,_std::vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                 *)&stack0xffffffffffffffc8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_RDI);
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
              (in_RDI,(value_type *)in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_*,_std::vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
    ::operator++((__normal_iterator<const_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_*,_std::vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  return (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)in_RDI;
}

Assistant:

Vector<T*> GetVecOfPtrs (const Vector<std::unique_ptr<T> >& a)
    {
        Vector<T*> r;
        r.reserve(a.size());
        for (const auto& x : a)  r.push_back(x.get());
        return r;
    }